

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::DisableAllJoiners
          (Error *__return_storage_ptr__,CommissionerApp *this,JoinerType aType)

{
  initializer_list<unsigned_char> __l;
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  format_args args;
  string_view fmt;
  ErrorCode local_1d4;
  Error local_1d0;
  uchar local_1a1;
  iterator local_1a0;
  undefined8 local_198;
  anon_class_1_0_00000001 local_18a;
  v10 local_189;
  v10 *local_188;
  size_t local_180;
  string local_178;
  Error local_158;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_130;
  ByteArray *steeringData;
  undefined1 local_118 [8];
  CommissionerDataset commDataset;
  JoinerType aType_local;
  CommissionerApp *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  commDataset.mAeUdpPort._1_1_ = 0;
  commDataset._84_4_ = aType;
  Error::Error(__return_storage_ptr__);
  CommissionerDataset::CommissionerDataset((CommissionerDataset *)local_118,&this->mCommDataset);
  commDataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       commDataset.mNmkpSteeringData.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 0x3f;
  local_130 = GetSteeringData((CommissionerDataset *)local_118,commDataset._84_4_);
  uVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
  if ((uVar2 & 1) == 0) {
    DisableAllJoiners::anon_class_1_0_00000001::operator()(&local_18a);
    local_58 = &local_188;
    local_60 = &local_189;
    bVar4 = ::fmt::v10::operator()(local_60);
    local_180 = bVar4.size_;
    local_188 = (v10 *)bVar4.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_178;
    local_78 = local_188;
    sStack_70 = local_180;
    local_50 = &local_78;
    local_88 = local_188;
    local_80 = local_180;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_18 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_178,local_88,fmt,args);
    Error::Error(&local_158,kInvalidState,&local_178);
    Error::operator=(__return_storage_ptr__,&local_158);
    Error::~Error(&local_158);
    std::__cxx11::string::~string((string *)&local_178);
  }
  else {
    local_1a1 = '\0';
    local_1a0 = &local_1a1;
    local_198 = 1;
    __l._M_len = 1;
    __l._M_array = local_1a0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(local_130,__l);
    peVar3 = std::
             __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mCommissioner);
    (*peVar3->_vptr_Commissioner[0x14])(&local_1d0,peVar3,local_118);
    aError = Error::operator=(__return_storage_ptr__,&local_1d0);
    local_1d4 = kNone;
    bVar1 = commissioner::operator!=(aError,&local_1d4);
    Error::~Error(&local_1d0);
    if (!bVar1) {
      MergeDataset(&this->mCommDataset,(CommissionerDataset *)local_118);
      EraseAllJoiners(this,commDataset._84_4_);
    }
  }
  commDataset.mAeUdpPort._1_1_ = 1;
  CommissionerDataset::~CommissionerDataset((CommissionerDataset *)local_118);
  if ((commDataset.mAeUdpPort._1_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::DisableAllJoiners(JoinerType aType)
{
    Error error;
    auto  commDataset = mCommDataset;
    commDataset.mPresentFlags &= ~CommissionerDataset::kSessionIdBit;
    commDataset.mPresentFlags &= ~CommissionerDataset::kBorderAgentLocatorBit;
    auto &steeringData = GetSteeringData(commDataset, aType);

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    // Set steering data to all 0 to disable all joiners.
    steeringData = {0x00};
    SuccessOrExit(error = mCommissioner->SetCommissionerDataset(commDataset));

    MergeDataset(mCommDataset, commDataset);
    EraseAllJoiners(aType);

exit:
    return error;
}